

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerFlight::InitEffect(APowerFlight *this)

{
  byte *pbVar1;
  double dVar2;
  AActor *pAVar3;
  TObjPtr<AActor> *obj;
  
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  *(byte *)&(pAVar3->flags2).Value = (byte)(pAVar3->flags2).Value | 0x10;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  pbVar1 = (byte *)((long)&(pAVar3->flags).Value + 1);
  *pbVar1 = *pbVar1 | 2;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar2 = (pAVar3->__Pos).Z;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (dVar2 <= pAVar3->floorz) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar3->Vel).Z = 4.0;
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (-35.0 < (pAVar3->Vel).Z) {
    return;
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  S_StopSound(pAVar3,2);
  return;
}

Assistant:

void APowerFlight::InitEffect ()
{
	Super::InitEffect();
	Owner->flags2 |= MF2_FLY;
	Owner->flags |= MF_NOGRAVITY;
	if (Owner->Z() <= Owner->floorz)
	{
		Owner->Vel.Z = 4;;	// thrust the player in the air a bit
	}
	if (Owner->Vel.Z <= -35)
	{ // stop falling scream
		S_StopSound (Owner, CHAN_VOICE);
	}
}